

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3AtoF(char *z,double *pResult,int length,u8 enc)

{
  bool bVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  longdouble in_ST0;
  bool local_101;
  long local_100;
  double local_f0;
  int local_e4;
  longdouble scale_1;
  longdouble scale;
  uint local_6c;
  int i;
  int nonNum;
  int nDigits;
  double result;
  int eValid;
  int e;
  int esign;
  int d;
  i64 s;
  double *pdStack_38;
  int sign;
  char *zEnd;
  int incr;
  u8 enc_local;
  int length_local;
  double *pResult_local;
  char *z_local;
  
  lVar2 = (long)length;
  s._4_4_ = 1;
  _esign = 0;
  e = 0;
  eValid = 1;
  result._4_4_ = 0;
  bVar1 = true;
  i = 0;
  bVar3 = false;
  *pResult = 0.0;
  if (enc == '\x01') {
    zEnd._4_4_ = 1;
    pResult_local = (double *)z;
  }
  else {
    zEnd._4_4_ = 2;
    local_6c = 3 - enc;
    while( true ) {
      bVar3 = false;
      if ((int)local_6c < length) {
        bVar3 = z[(int)local_6c] == '\0';
      }
      if (!bVar3) break;
      local_6c = local_6c + 2;
    }
    bVar3 = (int)local_6c < length;
    lVar2 = (long)(int)(local_6c ^ 1);
    pResult_local = (double *)(z + (int)(enc & 1));
  }
  pdStack_38 = (double *)(z + lVar2);
  while( true ) {
    bVar4 = false;
    if (pResult_local < pdStack_38) {
      bVar4 = (""[*(byte *)pResult_local] & 1) != 0;
    }
    if (!bVar4) break;
    pResult_local = (double *)((long)pResult_local + (long)zEnd._4_4_);
  }
  if (pdStack_38 <= pResult_local) {
    return 0;
  }
  if (*(char *)pResult_local == '-') {
    s._4_4_ = -1;
    pResult_local = (double *)((long)pResult_local + (long)zEnd._4_4_);
  }
  else if (*(char *)pResult_local == '+') {
    pResult_local = (double *)((long)pResult_local + (long)zEnd._4_4_);
  }
  while( true ) {
    bVar4 = false;
    if ((pResult_local < pdStack_38) && (bVar4 = false, (""[*(byte *)pResult_local] & 4) != 0)) {
      bVar4 = _esign < 0xccccccccccccccb;
    }
    if (!bVar4) break;
    _esign = _esign * 10 + (long)(*(char *)pResult_local + -0x30);
    pResult_local = (double *)((long)pResult_local + (long)zEnd._4_4_);
    i = i + 1;
  }
  while( true ) {
    bVar4 = false;
    if (pResult_local < pdStack_38) {
      bVar4 = (""[*(byte *)pResult_local] & 4) != 0;
    }
    if (!bVar4) break;
    pResult_local = (double *)((long)pResult_local + (long)zEnd._4_4_);
    i = i + 1;
    e = e + 1;
  }
  if (pResult_local < pdStack_38) {
    if (*(char *)pResult_local == '.') {
      pResult_local = (double *)((long)pResult_local + (long)zEnd._4_4_);
      while( true ) {
        bVar4 = false;
        if (pResult_local < pdStack_38) {
          bVar4 = (""[*(byte *)pResult_local] & 4) != 0;
        }
        if (!bVar4) break;
        if (_esign < 0xccccccccccccccb) {
          _esign = _esign * 10 + (long)(*(char *)pResult_local + -0x30);
          e = e + -1;
        }
        pResult_local = (double *)((long)pResult_local + (long)zEnd._4_4_);
        i = i + 1;
      }
    }
    if (pResult_local < pdStack_38) {
      if ((*(char *)pResult_local == 'e') || (*(char *)pResult_local == 'E')) {
        pResult_local = (double *)((long)pResult_local + (long)zEnd._4_4_);
        bVar1 = false;
        if (pdStack_38 <= pResult_local) goto LAB_0018e90b;
        if (*(char *)pResult_local == '-') {
          eValid = -1;
          pResult_local = (double *)((long)pResult_local + (long)zEnd._4_4_);
        }
        else if (*(char *)pResult_local == '+') {
          pResult_local = (double *)((long)pResult_local + (long)zEnd._4_4_);
        }
        while( true ) {
          bVar4 = false;
          if (pResult_local < pdStack_38) {
            bVar4 = (""[*(byte *)pResult_local] & 4) != 0;
          }
          if (!bVar4) break;
          if ((int)result._4_4_ < 10000) {
            local_e4 = result._4_4_ * 10 + *(char *)pResult_local + -0x30;
          }
          else {
            local_e4 = 10000;
          }
          result._4_4_ = local_e4;
          pResult_local = (double *)((long)pResult_local + (long)zEnd._4_4_);
          bVar1 = true;
        }
      }
      while( true ) {
        bVar4 = false;
        if (pResult_local < pdStack_38) {
          bVar4 = (""[*(byte *)pResult_local] & 1) != 0;
        }
        if (!bVar4) break;
        pResult_local = (double *)((long)pResult_local + (long)zEnd._4_4_);
      }
    }
  }
LAB_0018e90b:
  result._4_4_ = result._4_4_ * eValid + e;
  if ((int)result._4_4_ < 0) {
    eValid = -1;
    result._4_4_ = -result._4_4_;
  }
  else {
    eValid = 1;
  }
  if (_esign == 0) {
    local_f0 = -0.0;
    if (-1 < s._4_4_) {
      local_f0 = 0.0;
    }
    _nonNum = local_f0;
  }
  else {
    for (; 0 < (int)result._4_4_; result._4_4_ = result._4_4_ - 1) {
      if (eValid < 1) {
        if (_esign % 10 != 0) break;
        _esign = _esign / 10;
      }
      else {
        if (0xccccccccccccccb < _esign) break;
        _esign = _esign * 10;
      }
    }
    if (s._4_4_ < 0) {
      local_100 = -_esign;
    }
    else {
      local_100 = _esign;
    }
    if (result._4_4_ == 0) {
      _nonNum = (double)local_100;
    }
    else if ((int)result._4_4_ < 0x134) {
      sqlite3Pow10((longdouble *)(ulong)result._4_4_,(int)pResult);
      if (eValid < 0) {
        in_ST0 = (longdouble)local_100 / in_ST0;
      }
      else {
        in_ST0 = in_ST0 * (longdouble)local_100;
      }
      _nonNum = (double)in_ST0;
    }
    else if ((int)result._4_4_ < 0x156) {
      sqlite3Pow10((longdouble *)(ulong)(result._4_4_ - 0x134),(int)pResult);
      if (eValid < 0) {
        _nonNum = (double)((longdouble)local_100 / in_ST0) / 1e+308;
      }
      else {
        _nonNum = (double)(in_ST0 * (longdouble)local_100) * 1e+308;
      }
    }
    else if (eValid < 0) {
      _nonNum = (double)local_100 * 0.0;
    }
    else {
      _nonNum = (double)local_100 * INFINITY;
    }
  }
  *pResult = _nonNum;
  local_101 = false;
  if (((pResult_local == pdStack_38) && (local_101 = false, 0 < i)) && (local_101 = false, bVar1)) {
    local_101 = !bVar3;
  }
  return (uint)local_101;
}

Assistant:

SQLITE_PRIVATE int sqlite3AtoF(const char *z, double *pResult, int length, u8 enc){
#ifndef SQLITE_OMIT_FLOATING_POINT
  int incr;
  const char *zEnd = z + length;
  /* sign * significand * (10 ^ (esign * exponent)) */
  int sign = 1;    /* sign of significand */
  i64 s = 0;       /* significand */
  int d = 0;       /* adjust exponent for shifting decimal point */
  int esign = 1;   /* sign of exponent */
  int e = 0;       /* exponent */
  int eValid = 1;  /* True exponent is either not used or is well-formed */
  double result;
  int nDigits = 0;
  int nonNum = 0;  /* True if input contains UTF16 with high byte non-zero */

  assert( enc==SQLITE_UTF8 || enc==SQLITE_UTF16LE || enc==SQLITE_UTF16BE );
  *pResult = 0.0;   /* Default return value, in case of an error */

  if( enc==SQLITE_UTF8 ){
    incr = 1;
  }else{
    int i;
    incr = 2;
    assert( SQLITE_UTF16LE==2 && SQLITE_UTF16BE==3 );
    for(i=3-enc; i<length && z[i]==0; i+=2){}
    nonNum = i<length;
    zEnd = &z[i^1];
    z += (enc&1);
  }

  /* skip leading spaces */
  while( z<zEnd && sqlite3Isspace(*z) ) z+=incr;
  if( z>=zEnd ) return 0;

  /* get sign of significand */
  if( *z=='-' ){
    sign = -1;
    z+=incr;
  }else if( *z=='+' ){
    z+=incr;
  }

  /* copy max significant digits to significand */
  while( z<zEnd && sqlite3Isdigit(*z) && s<((LARGEST_INT64-9)/10) ){
    s = s*10 + (*z - '0');
    z+=incr; nDigits++;
  }

  /* skip non-significant significand digits
  ** (increase exponent by d to shift decimal left) */
  while( z<zEnd && sqlite3Isdigit(*z) ){ z+=incr; nDigits++; d++; }
  if( z>=zEnd ) goto do_atof_calc;

  /* if decimal point is present */
  if( *z=='.' ){
    z+=incr;
    /* copy digits from after decimal to significand
    ** (decrease exponent by d to shift decimal right) */
    while( z<zEnd && sqlite3Isdigit(*z) ){
      if( s<((LARGEST_INT64-9)/10) ){
        s = s*10 + (*z - '0');
        d--;
      }
      z+=incr; nDigits++;
    }
  }
  if( z>=zEnd ) goto do_atof_calc;

  /* if exponent is present */
  if( *z=='e' || *z=='E' ){
    z+=incr;
    eValid = 0;

    /* This branch is needed to avoid a (harmless) buffer overread.  The 
    ** special comment alerts the mutation tester that the correct answer
    ** is obtained even if the branch is omitted */
    if( z>=zEnd ) goto do_atof_calc;              /*PREVENTS-HARMLESS-OVERREAD*/

    /* get sign of exponent */
    if( *z=='-' ){
      esign = -1;
      z+=incr;
    }else if( *z=='+' ){
      z+=incr;
    }
    /* copy digits to exponent */
    while( z<zEnd && sqlite3Isdigit(*z) ){
      e = e<10000 ? (e*10 + (*z - '0')) : 10000;
      z+=incr;
      eValid = 1;
    }
  }

  /* skip trailing spaces */
  while( z<zEnd && sqlite3Isspace(*z) ) z+=incr;

do_atof_calc:
  /* adjust exponent by d, and update sign */
  e = (e*esign) + d;
  if( e<0 ) {
    esign = -1;
    e *= -1;
  } else {
    esign = 1;
  }

  if( s==0 ) {
    /* In the IEEE 754 standard, zero is signed. */
    result = sign<0 ? -(double)0 : (double)0;
  } else {
    /* Attempt to reduce exponent.
    **
    ** Branches that are not required for the correct answer but which only
    ** help to obtain the correct answer faster are marked with special
    ** comments, as a hint to the mutation tester.
    */
    while( e>0 ){                                       /*OPTIMIZATION-IF-TRUE*/
      if( esign>0 ){
        if( s>=(LARGEST_INT64/10) ) break;             /*OPTIMIZATION-IF-FALSE*/
        s *= 10;
      }else{
        if( s%10!=0 ) break;                           /*OPTIMIZATION-IF-FALSE*/
        s /= 10;
      }
      e--;
    }

    /* adjust the sign of significand */
    s = sign<0 ? -s : s;

    if( e==0 ){                                         /*OPTIMIZATION-IF-TRUE*/
      result = (double)s;
    }else{
      /* attempt to handle extremely small/large numbers better */
      if( e>307 ){                                      /*OPTIMIZATION-IF-TRUE*/
        if( e<342 ){                                    /*OPTIMIZATION-IF-TRUE*/
          LONGDOUBLE_TYPE scale = sqlite3Pow10(e-308);
          if( esign<0 ){
            result = s / scale;
            result /= 1.0e+308;
          }else{
            result = s * scale;
            result *= 1.0e+308;
          }
        }else{ assert( e>=342 );
          if( esign<0 ){
            result = 0.0*s;
          }else{
#ifdef INFINITY
            result = INFINITY*s;
#else
            result = 1e308*1e308*s;  /* Infinity */
#endif
          }
        }
      }else{
        LONGDOUBLE_TYPE scale = sqlite3Pow10(e);
        if( esign<0 ){
          result = s / scale;
        }else{
          result = s * scale;
        }
      }
    }
  }

  /* store the result */
  *pResult = result;

  /* return true if number and no extra non-whitespace chracters after */
  return z==zEnd && nDigits>0 && eValid && nonNum==0;
#else
  return !sqlite3Atoi64(z, pResult, length, enc);
#endif /* SQLITE_OMIT_FLOATING_POINT */
}